

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O0

void ge_add(ge_p1p1 *r,ge_p3 *p,ge_cached *q)

{
  i32 local_48 [2];
  fe t0;
  ge_cached *q_local;
  ge_p3 *p_local;
  ge_p1p1 *r_local;
  
  t0._32_8_ = q;
  fe_add(r->X,p->Y,p->X);
  fe_sub(r->Y,p->Y,p->X);
  fe_mul(r->Z,r->X,(i32 *)t0._32_8_);
  fe_mul(r->Y,r->Y,(i32 *)(t0._32_8_ + 0x28));
  fe_mul(r->T,(i32 *)(t0._32_8_ + 0x78),p->T);
  fe_mul(r->X,p->Z,(i32 *)(t0._32_8_ + 0x50));
  fe_add(local_48,r->X,r->X);
  fe_sub(r->X,r->Z,r->Y);
  fe_add(r->Y,r->Z,r->Y);
  fe_add(r->Z,local_48,r->T);
  fe_sub(r->T,local_48,r->T);
  return;
}

Assistant:

void ge_add(ge_p1p1 *r, const ge_p3 *p, const ge_cached *q) {
    fe t0;
    fe_add(r->X, p->Y, p->X);
    fe_sub(r->Y, p->Y, p->X);
    fe_mul(r->Z, r->X, q->YplusX);
    fe_mul(r->Y, r->Y, q->YminusX);
    fe_mul(r->T, q->T2d, p->T);
    fe_mul(r->X, p->Z, q->Z);
    fe_add(t0, r->X, r->X);
    fe_sub(r->X, r->Z, r->Y);
    fe_add(r->Y, r->Z, r->Y);
    fe_add(r->Z, t0, r->T);
    fe_sub(r->T, t0, r->T);
}